

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_48f05::CleanTestCleanDepFileAndRspFileWithSpaces::Run
          (CleanTestCleanDepFileAndRspFileWithSpaces *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *pTVar1;
  int iVar2;
  TimeStamp TVar3;
  string err;
  Cleaner cleaner;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  Cleaner local_c0;
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cc_dep\n  command = cc $in > $out\n  depfile = $out.d\nrule cc_rsp\n  command = cc $in > $out\n  rspfile = $out.rsp\n  rspfile_content = $in\nbuild out$ 1: cc_dep in$ 1\nbuild out$ 2: cc_rsp in$ 1\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out 1",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out 2",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out 1.d",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out 2.rsp",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    Cleaner::Cleaner(&local_c0,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    pTVar1 = g_current_test;
    iVar2 = Cleaner::CleanAll(&local_c0,false);
    testing::Test::Check
              (pTVar1,iVar2 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1ca,"0 == cleaner.CleanAll()");
    testing::Test::Check
              (g_current_test,local_c0.cleaned_files_count_ == 4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1cb,"4 == cleaner.cleaned_files_count()");
    testing::Test::Check
              (g_current_test,
               (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count == 4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1cc,"4u == fs_.files_removed_.size()");
    pTVar1 = g_current_test;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out 1",&local_101);
    TVar3 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
    testing::Test::Check
              (pTVar1,TVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1cf,"0 == fs_.Stat(\"out 1\", &err)");
    std::__cxx11::string::~string((string *)&local_e0);
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out 2",&local_101);
    TVar3 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
    testing::Test::Check
              (pTVar1,TVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1d0,"0 == fs_.Stat(\"out 2\", &err)");
    std::__cxx11::string::~string((string *)&local_e0);
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out 1.d",&local_101);
    TVar3 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
    testing::Test::Check
              (pTVar1,TVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1d1,"0 == fs_.Stat(\"out 1.d\", &err)");
    std::__cxx11::string::~string((string *)&local_e0);
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out 2.rsp",&local_101);
    TVar3 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
    testing::Test::Check
              (pTVar1,TVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1d2,"0 == fs_.Stat(\"out 2.rsp\", &err)");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    Cleaner::~Cleaner(&local_c0);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDepFileAndRspFileWithSpaces) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc_dep\n"
"  command = cc $in > $out\n"
"  depfile = $out.d\n"
"rule cc_rsp\n"
"  command = cc $in > $out\n"
"  rspfile = $out.rsp\n"
"  rspfile_content = $in\n"
"build out$ 1: cc_dep in$ 1\n"
"build out$ 2: cc_rsp in$ 1\n"
));
  fs_.Create("out 1", "");
  fs_.Create("out 2", "");
  fs_.Create("out 1.d", "");
  fs_.Create("out 2.rsp", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(4, cleaner.cleaned_files_count());
  EXPECT_EQ(4u, fs_.files_removed_.size());

  string err;
  EXPECT_EQ(0, fs_.Stat("out 1", &err));
  EXPECT_EQ(0, fs_.Stat("out 2", &err));
  EXPECT_EQ(0, fs_.Stat("out 1.d", &err));
  EXPECT_EQ(0, fs_.Stat("out 2.rsp", &err));
}